

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

void lgx_str_dup(lgx_str_t *src,lgx_str_t *dst)

{
  uint uVar1;
  char *__assertion;
  
  uVar1 = src->length;
  if (((ulong)uVar1 == 0) || (src->buffer == (char *)0x0)) {
    __assertion = "src->length > 0 && src->buffer";
    uVar1 = 0x50;
  }
  else if ((dst->size == 0) || (dst->buffer == (char *)0x0)) {
    __assertion = "dst->size > 0 && dst->buffer";
    uVar1 = 0x51;
  }
  else {
    if (uVar1 <= dst->size) {
      memcpy(dst->buffer,src->buffer,(ulong)uVar1);
      dst->length = src->length;
      return;
    }
    __assertion = "dst->size >= src->length";
    uVar1 = 0x52;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/common/str.c"
                ,uVar1,"void lgx_str_dup(lgx_str_t *, lgx_str_t *)");
}

Assistant:

void lgx_str_dup(lgx_str_t *src, lgx_str_t *dst) {
    assert(src->length > 0 && src->buffer);
    assert(dst->size > 0 && dst->buffer);
    assert(dst->size >= src->length);

    memcpy(dst->buffer, src->buffer, src->length);
    dst->length = src->length;
}